

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O2

void __thiscall
icu_63::ContractionsAndExpansions::handleContractions
          (ContractionsAndExpansions *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  UBool UVar1;
  undefined2 *puVar2;
  Iterator suffixes;
  ConstChar16Ptr local_c0;
  char16_t *local_b8;
  Iterator local_a8;
  
  puVar2 = (undefined2 *)((ulong)(ce32 >> 0xc & 0xfffffffe) + (long)this->data->contexts);
  if ((ce32 >> 8 & 1) == 0) {
    handleCE32(this,start,end,CONCAT22(*puVar2,puVar2[1]));
  }
  local_c0.p_ = puVar2 + 2;
  UCharsTrie::Iterator::Iterator(&local_a8,&local_c0,0,&this->errorCode);
  local_b8 = local_c0.p_;
  while( true ) {
    UVar1 = UCharsTrie::Iterator::next(&local_a8,&this->errorCode);
    if (UVar1 == '\0') break;
    this->suffix = &local_a8.str_;
    addStrings(this,start,end,this->contractions);
    if (0x1f < (ushort)(this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags) {
      addStrings(this,start,end,this->expansions);
    }
    handleCE32(this,start,end,local_a8.value_);
  }
  this->suffix = (UnicodeString *)0x0;
  UCharsTrie::Iterator::~Iterator(&local_a8);
  return;
}

Assistant:

void
ContractionsAndExpansions::handleContractions(
        UChar32 start, UChar32 end, uint32_t ce32) {
    const UChar *p = data->contexts + Collation::indexFromCE32(ce32);
    if((ce32 & Collation::CONTRACT_SINGLE_CP_NO_MATCH) != 0) {
        // No match on the single code point.
        // We are underneath a prefix, and the default mapping is just
        // a fallback to the mappings for a shorter prefix.
        U_ASSERT(!unreversedPrefix.isEmpty());
    } else {
        ce32 = CollationData::readCE32(p);  // Default if no suffix match.
        U_ASSERT(!Collation::isContractionCE32(ce32));
        handleCE32(start, end, ce32);
    }
    UCharsTrie::Iterator suffixes(p + 2, 0, errorCode);
    while(suffixes.next(errorCode)) {
        suffix = &suffixes.getString();
        addStrings(start, end, contractions);
        if(!unreversedPrefix.isEmpty()) {
            addStrings(start, end, expansions);
        }
        handleCE32(start, end, (uint32_t)suffixes.getValue());
    }
    suffix = NULL;
}